

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Quaternion QuaternionNormalize(Quaternion q)

{
  Quaternion QVar1;
  undefined4 local_2c;
  float ilength;
  float length;
  Quaternion q_local;
  Quaternion result;
  
  ilength = q.x;
  length = q.y;
  q_local.x = q.z;
  q_local.y = q.w;
  local_2c = QuaternionLength(q);
  if ((local_2c == 0.0) && (!NAN(local_2c))) {
    local_2c = 1.0;
  }
  local_2c = 1.0 / local_2c;
  QVar1.y = length * local_2c;
  QVar1.x = ilength * local_2c;
  QVar1.z = q_local.x * local_2c;
  QVar1.w = q_local.y * local_2c;
  return QVar1;
}

Assistant:

RMDEF Quaternion QuaternionNormalize(Quaternion q)
{
    Quaternion result = { 0 };

    float length, ilength;
    length = QuaternionLength(q);
    if (length == 0.0f) length = 1.0f;
    ilength = 1.0f/length;

    result.x = q.x*ilength;
    result.y = q.y*ilength;
    result.z = q.z*ilength;
    result.w = q.w*ilength;

    return result;
}